

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
        *this)

{
  ulong uVar1;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[uVar1] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}